

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O1

void ncnn::draw_rectangle_c2
               (uchar *pixels,int w,int h,int stride,int rx,int ry,int rw,int rh,uint color,
               int thickness)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uchar *puVar8;
  uchar uVar9;
  uchar uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  uVar9 = (uchar)color;
  uVar10 = (uchar)(color >> 8);
  if (thickness == -1) {
    if (0 < rh) {
      lVar4 = (long)ry;
      do {
        if (-1 < lVar4) {
          if (h <= lVar4) {
            return;
          }
          if (0 < rw) {
            uVar7 = rx * 2;
            iVar6 = rx;
            do {
              if (-1 < iVar6) {
                if (w <= iVar6) break;
                pixels[(ulong)uVar7 + lVar4 * stride] = uVar9;
                pixels[(ulong)(uVar7 + 1) + lVar4 * stride] = uVar10;
              }
              iVar6 = iVar6 + 1;
              uVar7 = uVar7 + 2;
            } while (iVar6 < rw + rx);
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < rh + ry);
    }
  }
  else {
    iVar6 = thickness / 2;
    iVar2 = thickness - iVar6;
    iVar5 = iVar2 + ry;
    if (ry - iVar6 < iVar5) {
      lVar4 = (long)-iVar6 + (long)ry;
      do {
        if (-1 < lVar4) {
          if (h <= lVar4) break;
          if (rx - iVar6 < rw + rx + iVar2) {
            uVar7 = rx * 2 + iVar6 * -2;
            iVar11 = thickness + rw;
            iVar13 = rx - iVar6;
            do {
              if (-1 < iVar13) {
                if (w <= iVar13) break;
                pixels[(ulong)uVar7 + lVar4 * stride] = uVar9;
                pixels[(ulong)(uVar7 + 1) + lVar4 * stride] = uVar10;
              }
              iVar13 = iVar13 + 1;
              uVar7 = uVar7 + 2;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
        }
        lVar4 = lVar4 + 1;
      } while (iVar5 != (int)lVar4);
    }
    iVar13 = iVar2 + ry + rh;
    iVar11 = (ry + rh) - iVar6;
    if (iVar11 < iVar13) {
      lVar4 = (long)iVar11;
      do {
        if (-1 < lVar4) {
          if (h <= lVar4) break;
          if (rx - iVar6 < rw + rx + iVar2) {
            uVar7 = rx * 2 + iVar6 * -2;
            iVar12 = thickness + rw;
            iVar1 = rx - iVar6;
            do {
              if (-1 < iVar1) {
                if (w <= iVar1) break;
                pixels[(ulong)uVar7 + lVar4 * stride] = uVar9;
                pixels[(ulong)(uVar7 + 1) + lVar4 * stride] = uVar10;
              }
              iVar1 = iVar1 + 1;
              uVar7 = uVar7 + 2;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
        }
        lVar4 = lVar4 + 1;
      } while (iVar13 != (int)lVar4);
    }
    iVar13 = rx - iVar6;
    if (iVar13 < iVar2 + rx) {
      uVar3 = rx * 2 + iVar6 * -2;
      uVar7 = uVar3 + 1;
      do {
        if (-1 < iVar13) {
          if (w <= iVar13) break;
          puVar8 = pixels + (long)stride * (long)iVar5;
          lVar4 = (long)iVar5;
          iVar12 = rh - thickness;
          if (iVar5 < iVar11) {
            do {
              if (-1 < lVar4) {
                if (h <= lVar4) break;
                puVar8[uVar3] = uVar9;
                puVar8[uVar7] = uVar10;
              }
              iVar12 = iVar12 + -1;
              puVar8 = puVar8 + stride;
              lVar4 = lVar4 + 1;
            } while (iVar12 != 0);
          }
        }
        iVar13 = iVar13 + 1;
        uVar3 = uVar3 + 2;
        uVar7 = uVar7 + 2;
      } while (iVar13 != iVar2 + rx);
    }
    iVar2 = iVar2 + rw + rx;
    iVar6 = (rw + rx) - iVar6;
    if (iVar6 < iVar2) {
      uVar3 = iVar6 * 2;
      uVar7 = iVar6 * 2 + 1;
      do {
        if (-1 < iVar6) {
          if (w <= iVar6) {
            return;
          }
          lVar4 = (long)iVar5;
          puVar8 = pixels + (long)stride * (long)iVar5;
          iVar13 = rh - thickness;
          if (iVar5 < iVar11) {
            do {
              if (-1 < lVar4) {
                if (h <= lVar4) break;
                puVar8[uVar3] = uVar9;
                puVar8[uVar7] = uVar10;
              }
              iVar13 = iVar13 + -1;
              lVar4 = lVar4 + 1;
              puVar8 = puVar8 + stride;
            } while (iVar13 != 0);
          }
        }
        iVar6 = iVar6 + 1;
        uVar3 = uVar3 + 2;
        uVar7 = uVar7 + 2;
      } while (iVar6 != iVar2);
    }
  }
  return;
}

Assistant:

void draw_rectangle_c2(unsigned char* pixels, int w, int h, int stride, int rx, int ry, int rw, int rh, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    if (thickness == -1)
    {
        // filled
        for (int y = ry; y < ry + rh; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx; x < rx + rw; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }

        return;
    }

    const int t0 = thickness / 2;
    const int t1 = thickness - t0;

    // draw top
    {
        for (int y = ry - t0; y < ry + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw bottom
    {
        for (int y = ry + rh - t0; y < ry + rh + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw left
    for (int x = rx - t0; x < rx + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }

    // draw right
    for (int x = rx + rw - t0; x < rx + rw + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }
}